

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fkParentIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  char *zRight;
  int iVar1;
  undefined8 *puVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Column *pCol;
  int iKey;
  char *zKey;
  int i;
  int local_34;
  int local_28;
  
  local_28 = 0;
  do {
    if (*(int *)(in_RSI + 0x28) <= local_28) {
      return 0;
    }
    zRight = *(char **)(in_RSI + (long)local_28 * 0x10 + 0x48);
    for (local_34 = 0; local_34 < *(short *)(in_RDI + 0x36); local_34 = local_34 + 1) {
      if ((-1 < *(int *)(in_RDX + (long)local_34 * 4)) ||
         ((local_34 == *(short *)(in_RDI + 0x34) && (in_ECX != 0)))) {
        puVar2 = (undefined8 *)(*(long *)(in_RDI + 8) + (long)local_34 * 0x10);
        if (zRight == (char *)0x0) {
          if ((*(ushort *)((long)puVar2 + 0xe) & 1) != 0) {
            return 1;
          }
        }
        else {
          iVar1 = sqlite3StrICmp((char *)*puVar2,zRight);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int fkParentIsModified(
  Table *pTab,
  FKey *p,
  int *aChange,
  int bChngRowid
){
  int i;
  for(i=0; i<p->nCol; i++){
    char *zKey = p->aCol[i].zCol;
    int iKey;
    for(iKey=0; iKey<pTab->nCol; iKey++){
      if( aChange[iKey]>=0 || (iKey==pTab->iPKey && bChngRowid) ){
        Column *pCol = &pTab->aCol[iKey];
        if( zKey ){
          if( 0==sqlite3StrICmp(pCol->zCnName, zKey) ) return 1;
        }else if( pCol->colFlags & COLFLAG_PRIMKEY ){
          return 1;
        }
      }
    }
  }
  return 0;
}